

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O1

void __thiscall
HighsCliqueTable::queryNeighbourhood
          (HighsCliqueTable *this,vector<int,_std::allocator<int>_> *neighbourhoodInds,
          int64_t *numQueries,CliqueVar v,CliqueVar *q,HighsInt N)

{
  uint32_t *puVar1;
  __atomic_base<int> _Var2;
  uint uVar3;
  uint32_t uVar4;
  pointer piVar5;
  iterator __position;
  element_type *peVar6;
  pointer piVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  HighsTask *pHVar31;
  undefined1 auVar32 [16];
  unique_ptr<PaddedData[]> uVar33;
  HighsSplitDeque *pHVar34;
  HighsInt HVar35;
  int iVar36;
  void *pvVar37;
  ulong uVar38;
  uint start;
  long lVar39;
  long lVar40;
  int iVar50;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  int iVar52;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  long lVar51;
  undefined1 auVar53 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  int iVar73;
  undefined1 auVar71 [16];
  int iVar74;
  undefined1 auVar72 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  int iVar88;
  int iVar92;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>
  neighbourhoodData;
  HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>
  local_98;
  anon_class_32_4_8f8caa33 local_88;
  TaskGroup local_68;
  long *local_58;
  long *local_50;
  undefined1 local_48 [16];
  long lVar54;
  
  piVar5 = (neighbourhoodInds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((neighbourhoodInds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_finish != piVar5) {
    (neighbourhoodInds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_finish = piVar5;
  }
  if ((this->numcliquesvar).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[(int)((int)v << 1 | (uint)((int)v < 0))] != 0) {
    if ((long)((long)this->numEntries + (this->sizeTwoCliques).numElements * -2) <
        (long)this->minEntriesForParallelism) {
      local_88.this = (HighsCliqueTable *)((ulong)local_88.this & 0xffffffff00000000);
      if (0 < N) {
        iVar36 = 0;
        do {
          if (((((uint)q[iVar36] ^ (uint)v) & 0x7fffffff) != 0) &&
             (HVar35 = findCommonCliqueId(this,numQueries,v,q[iVar36]), HVar35 != -1)) {
            __position._M_current =
                 (neighbourhoodInds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (neighbourhoodInds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)neighbourhoodInds,__position,
                         (int *)&local_88);
            }
            else {
              *__position._M_current = (int)local_88.this;
              (neighbourhoodInds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
          }
          iVar36 = (int)local_88.this + 1;
          local_88.this = (HighsCliqueTable *)CONCAT44(local_88.this._4_4_,iVar36);
        } while (iVar36 < N);
      }
    }
    else {
      local_98.construct_.N = N;
      local_50 = numQueries;
      HighsTaskExecutor::threadLocalWorkerDequePtr::__tls_init();
      local_58 = (long *)__tls_get_addr(&PTR_00449ef0);
      iVar36 = *(int *)(*local_58 + 0x28);
      lVar39 = (long)iVar36;
      local_98.numThreads = iVar36;
      pvVar37 = operator_new(lVar39 * 0x40 + 0x40);
      uVar38 = (ulong)pvVar37 | 0x3f;
      local_98.threadCopies_._M_t.
      super___uniq_ptr_impl<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
      ._M_t.
      super__Tuple_impl<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
      .
      super__Head_base<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>,_true,_true>
            )(uVar38 + 1);
      *(void **)(uVar38 - 7) = pvVar37;
      auVar32 = _DAT_003c57d0;
      if (0 < lVar39) {
        lVar39 = lVar39 + -1;
        local_48._8_4_ = (int)lVar39;
        local_48._0_8_ = lVar39;
        local_48._12_4_ = (int)((ulong)lVar39 >> 0x20);
        lVar39 = 0;
        auVar41 = local_48;
        auVar53 = _DAT_003c5750;
        auVar55 = _DAT_003c5760;
        auVar56 = _DAT_003c5770;
        auVar57 = _DAT_003c5780;
        auVar58 = _DAT_003c5790;
        auVar59 = _DAT_003c57a0;
        auVar60 = _DAT_003c57b0;
        auVar61 = _DAT_003c57c0;
        do {
          auVar71 = local_48 ^ auVar32;
          auVar75 = auVar61 ^ auVar32;
          iVar50 = auVar71._0_4_;
          iVar88 = -(uint)(iVar50 < auVar75._0_4_);
          iVar52 = auVar71._4_4_;
          auVar77._4_4_ = -(uint)(iVar52 < auVar75._4_4_);
          iVar73 = auVar71._8_4_;
          iVar92 = -(uint)(iVar73 < auVar75._8_4_);
          iVar74 = auVar71._12_4_;
          auVar77._12_4_ = -(uint)(iVar74 < auVar75._12_4_);
          auVar71._4_4_ = iVar88;
          auVar71._0_4_ = iVar88;
          auVar71._8_4_ = iVar92;
          auVar71._12_4_ = iVar92;
          auVar71 = pshuflw(auVar41,auVar71,0xe8);
          auVar76._4_4_ = -(uint)(auVar75._4_4_ == iVar52);
          auVar76._12_4_ = -(uint)(auVar75._12_4_ == iVar74);
          auVar76._0_4_ = auVar76._4_4_;
          auVar76._8_4_ = auVar76._12_4_;
          auVar62 = pshuflw(in_XMM11,auVar76,0xe8);
          auVar77._0_4_ = auVar77._4_4_;
          auVar77._8_4_ = auVar77._12_4_;
          auVar75 = pshuflw(auVar71,auVar77,0xe8);
          auVar41._8_4_ = 0xffffffff;
          auVar41._0_8_ = 0xffffffffffffffff;
          auVar41._12_4_ = 0xffffffff;
          auVar41 = (auVar75 | auVar62 & auVar71) ^ auVar41;
          auVar41 = packssdw(auVar41,auVar41);
          if ((auVar41 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined1 *)
             ((long)local_98.threadCopies_._M_t.
                    super___uniq_ptr_impl<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
                    .
                    super__Head_base<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_false>
                    ._M_head_impl + lVar39) = 0;
          }
          auVar62._4_4_ = iVar88;
          auVar62._0_4_ = iVar88;
          auVar62._8_4_ = iVar92;
          auVar62._12_4_ = iVar92;
          auVar77 = auVar76 & auVar62 | auVar77;
          auVar41 = packssdw(auVar77,auVar77);
          auVar75._8_4_ = 0xffffffff;
          auVar75._0_8_ = 0xffffffffffffffff;
          auVar75._12_4_ = 0xffffffff;
          auVar41 = packssdw(auVar41 ^ auVar75,auVar41 ^ auVar75);
          auVar41 = packsswb(auVar41,auVar41);
          if ((auVar41._0_4_ >> 8 & 1) != 0) {
            *(undefined1 *)(uVar38 + 0x41 + lVar39) = 0;
          }
          auVar41 = auVar60 ^ auVar32;
          auVar63._0_4_ = -(uint)(iVar50 < auVar41._0_4_);
          auVar63._4_4_ = -(uint)(iVar52 < auVar41._4_4_);
          auVar63._8_4_ = -(uint)(iVar73 < auVar41._8_4_);
          auVar63._12_4_ = -(uint)(iVar74 < auVar41._12_4_);
          auVar78._4_4_ = auVar63._0_4_;
          auVar78._0_4_ = auVar63._0_4_;
          auVar78._8_4_ = auVar63._8_4_;
          auVar78._12_4_ = auVar63._8_4_;
          iVar88 = -(uint)(auVar41._4_4_ == iVar52);
          iVar92 = -(uint)(auVar41._12_4_ == iVar74);
          auVar18._4_4_ = iVar88;
          auVar18._0_4_ = iVar88;
          auVar18._8_4_ = iVar92;
          auVar18._12_4_ = iVar92;
          auVar89._4_4_ = auVar63._4_4_;
          auVar89._0_4_ = auVar63._4_4_;
          auVar89._8_4_ = auVar63._12_4_;
          auVar89._12_4_ = auVar63._12_4_;
          auVar41 = auVar18 & auVar78 | auVar89;
          auVar41 = packssdw(auVar41,auVar41);
          auVar9._8_4_ = 0xffffffff;
          auVar9._0_8_ = 0xffffffffffffffff;
          auVar9._12_4_ = 0xffffffff;
          auVar41 = packssdw(auVar41 ^ auVar9,auVar41 ^ auVar9);
          auVar41 = packsswb(auVar41,auVar41);
          if ((auVar41._0_4_ >> 0x10 & 1) != 0) {
            *(undefined1 *)(uVar38 + 0x81 + lVar39) = 0;
          }
          auVar41 = pshufhw(auVar41,auVar78,0x84);
          auVar19._4_4_ = iVar88;
          auVar19._0_4_ = iVar88;
          auVar19._8_4_ = iVar92;
          auVar19._12_4_ = iVar92;
          auVar75 = pshufhw(auVar63,auVar19,0x84);
          auVar71 = pshufhw(auVar41,auVar89,0x84);
          auVar42._8_4_ = 0xffffffff;
          auVar42._0_8_ = 0xffffffffffffffff;
          auVar42._12_4_ = 0xffffffff;
          auVar42 = (auVar71 | auVar75 & auVar41) ^ auVar42;
          auVar41 = packssdw(auVar42,auVar42);
          auVar41 = packsswb(auVar41,auVar41);
          if ((auVar41._0_4_ >> 0x18 & 1) != 0) {
            *(undefined1 *)(uVar38 + 0xc1 + lVar39) = 0;
          }
          auVar41 = auVar59 ^ auVar32;
          auVar64._0_4_ = -(uint)(iVar50 < auVar41._0_4_);
          auVar64._4_4_ = -(uint)(iVar52 < auVar41._4_4_);
          auVar64._8_4_ = -(uint)(iVar73 < auVar41._8_4_);
          auVar64._12_4_ = -(uint)(iVar74 < auVar41._12_4_);
          auVar20._4_4_ = auVar64._0_4_;
          auVar20._0_4_ = auVar64._0_4_;
          auVar20._8_4_ = auVar64._8_4_;
          auVar20._12_4_ = auVar64._8_4_;
          auVar75 = pshuflw(auVar89,auVar20,0xe8);
          auVar43._0_4_ = -(uint)(auVar41._0_4_ == iVar50);
          auVar43._4_4_ = -(uint)(auVar41._4_4_ == iVar52);
          auVar43._8_4_ = -(uint)(auVar41._8_4_ == iVar73);
          auVar43._12_4_ = -(uint)(auVar41._12_4_ == iVar74);
          auVar79._4_4_ = auVar43._4_4_;
          auVar79._0_4_ = auVar43._4_4_;
          auVar79._8_4_ = auVar43._12_4_;
          auVar79._12_4_ = auVar43._12_4_;
          auVar41 = pshuflw(auVar43,auVar79,0xe8);
          auVar80._4_4_ = auVar64._4_4_;
          auVar80._0_4_ = auVar64._4_4_;
          auVar80._8_4_ = auVar64._12_4_;
          auVar80._12_4_ = auVar64._12_4_;
          auVar71 = pshuflw(auVar64,auVar80,0xe8);
          auVar10._8_4_ = 0xffffffff;
          auVar10._0_8_ = 0xffffffffffffffff;
          auVar10._12_4_ = 0xffffffff;
          auVar41 = packssdw(auVar41 & auVar75,(auVar71 | auVar41 & auVar75) ^ auVar10);
          auVar41 = packsswb(auVar41,auVar41);
          if ((auVar41 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(undefined1 *)(uVar38 + 0x101 + lVar39) = 0;
          }
          auVar21._4_4_ = auVar64._0_4_;
          auVar21._0_4_ = auVar64._0_4_;
          auVar21._8_4_ = auVar64._8_4_;
          auVar21._12_4_ = auVar64._8_4_;
          auVar80 = auVar79 & auVar21 | auVar80;
          auVar71 = packssdw(auVar80,auVar80);
          auVar11._8_4_ = 0xffffffff;
          auVar11._0_8_ = 0xffffffffffffffff;
          auVar11._12_4_ = 0xffffffff;
          auVar41 = packssdw(auVar41,auVar71 ^ auVar11);
          auVar41 = packsswb(auVar41,auVar41);
          if ((auVar41._4_2_ >> 8 & 1) != 0) {
            *(undefined1 *)(uVar38 + 0x141 + lVar39) = 0;
          }
          auVar41 = auVar58 ^ auVar32;
          auVar65._0_4_ = -(uint)(iVar50 < auVar41._0_4_);
          auVar65._4_4_ = -(uint)(iVar52 < auVar41._4_4_);
          auVar65._8_4_ = -(uint)(iVar73 < auVar41._8_4_);
          auVar65._12_4_ = -(uint)(iVar74 < auVar41._12_4_);
          auVar81._4_4_ = auVar65._0_4_;
          auVar81._0_4_ = auVar65._0_4_;
          auVar81._8_4_ = auVar65._8_4_;
          auVar81._12_4_ = auVar65._8_4_;
          iVar88 = -(uint)(auVar41._4_4_ == iVar52);
          iVar92 = -(uint)(auVar41._12_4_ == iVar74);
          auVar22._4_4_ = iVar88;
          auVar22._0_4_ = iVar88;
          auVar22._8_4_ = iVar92;
          auVar22._12_4_ = iVar92;
          auVar90._4_4_ = auVar65._4_4_;
          auVar90._0_4_ = auVar65._4_4_;
          auVar90._8_4_ = auVar65._12_4_;
          auVar90._12_4_ = auVar65._12_4_;
          auVar41 = auVar22 & auVar81 | auVar90;
          auVar41 = packssdw(auVar41,auVar41);
          auVar12._8_4_ = 0xffffffff;
          auVar12._0_8_ = 0xffffffffffffffff;
          auVar12._12_4_ = 0xffffffff;
          auVar41 = packssdw(auVar41 ^ auVar12,auVar41 ^ auVar12);
          auVar41 = packsswb(auVar41,auVar41);
          if ((auVar41 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(undefined1 *)(uVar38 + 0x181 + lVar39) = 0;
          }
          auVar41 = pshufhw(auVar41,auVar81,0x84);
          auVar23._4_4_ = iVar88;
          auVar23._0_4_ = iVar88;
          auVar23._8_4_ = iVar92;
          auVar23._12_4_ = iVar92;
          auVar75 = pshufhw(auVar65,auVar23,0x84);
          auVar71 = pshufhw(auVar41,auVar90,0x84);
          auVar44._8_4_ = 0xffffffff;
          auVar44._0_8_ = 0xffffffffffffffff;
          auVar44._12_4_ = 0xffffffff;
          auVar44 = (auVar71 | auVar75 & auVar41) ^ auVar44;
          auVar41 = packssdw(auVar44,auVar44);
          auVar41 = packsswb(auVar41,auVar41);
          if ((auVar41._6_2_ >> 8 & 1) != 0) {
            *(undefined1 *)(uVar38 + 0x1c1 + lVar39) = 0;
          }
          auVar41 = auVar57 ^ auVar32;
          auVar66._0_4_ = -(uint)(iVar50 < auVar41._0_4_);
          auVar66._4_4_ = -(uint)(iVar52 < auVar41._4_4_);
          auVar66._8_4_ = -(uint)(iVar73 < auVar41._8_4_);
          auVar66._12_4_ = -(uint)(iVar74 < auVar41._12_4_);
          auVar24._4_4_ = auVar66._0_4_;
          auVar24._0_4_ = auVar66._0_4_;
          auVar24._8_4_ = auVar66._8_4_;
          auVar24._12_4_ = auVar66._8_4_;
          auVar75 = pshuflw(auVar90,auVar24,0xe8);
          auVar45._0_4_ = -(uint)(auVar41._0_4_ == iVar50);
          auVar45._4_4_ = -(uint)(auVar41._4_4_ == iVar52);
          auVar45._8_4_ = -(uint)(auVar41._8_4_ == iVar73);
          auVar45._12_4_ = -(uint)(auVar41._12_4_ == iVar74);
          auVar82._4_4_ = auVar45._4_4_;
          auVar82._0_4_ = auVar45._4_4_;
          auVar82._8_4_ = auVar45._12_4_;
          auVar82._12_4_ = auVar45._12_4_;
          auVar41 = pshuflw(auVar45,auVar82,0xe8);
          auVar83._4_4_ = auVar66._4_4_;
          auVar83._0_4_ = auVar66._4_4_;
          auVar83._8_4_ = auVar66._12_4_;
          auVar83._12_4_ = auVar66._12_4_;
          auVar71 = pshuflw(auVar66,auVar83,0xe8);
          auVar67._8_4_ = 0xffffffff;
          auVar67._0_8_ = 0xffffffffffffffff;
          auVar67._12_4_ = 0xffffffff;
          auVar67 = (auVar71 | auVar41 & auVar75) ^ auVar67;
          auVar71 = packssdw(auVar67,auVar67);
          auVar41 = packsswb(auVar41 & auVar75,auVar71);
          if ((auVar41 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined1 *)(uVar38 + 0x201 + lVar39) = 0;
          }
          auVar25._4_4_ = auVar66._0_4_;
          auVar25._0_4_ = auVar66._0_4_;
          auVar25._8_4_ = auVar66._8_4_;
          auVar25._12_4_ = auVar66._8_4_;
          auVar83 = auVar82 & auVar25 | auVar83;
          auVar71 = packssdw(auVar83,auVar83);
          auVar13._8_4_ = 0xffffffff;
          auVar13._0_8_ = 0xffffffffffffffff;
          auVar13._12_4_ = 0xffffffff;
          auVar71 = packssdw(auVar71 ^ auVar13,auVar71 ^ auVar13);
          auVar41 = packsswb(auVar41,auVar71);
          if ((auVar41._8_2_ >> 8 & 1) != 0) {
            *(undefined1 *)(uVar38 + 0x241 + lVar39) = 0;
          }
          auVar41 = auVar56 ^ auVar32;
          auVar68._0_4_ = -(uint)(iVar50 < auVar41._0_4_);
          auVar68._4_4_ = -(uint)(iVar52 < auVar41._4_4_);
          auVar68._8_4_ = -(uint)(iVar73 < auVar41._8_4_);
          auVar68._12_4_ = -(uint)(iVar74 < auVar41._12_4_);
          auVar84._4_4_ = auVar68._0_4_;
          auVar84._0_4_ = auVar68._0_4_;
          auVar84._8_4_ = auVar68._8_4_;
          auVar84._12_4_ = auVar68._8_4_;
          iVar88 = -(uint)(auVar41._4_4_ == iVar52);
          iVar92 = -(uint)(auVar41._12_4_ == iVar74);
          auVar26._4_4_ = iVar88;
          auVar26._0_4_ = iVar88;
          auVar26._8_4_ = iVar92;
          auVar26._12_4_ = iVar92;
          auVar91._4_4_ = auVar68._4_4_;
          auVar91._0_4_ = auVar68._4_4_;
          auVar91._8_4_ = auVar68._12_4_;
          auVar91._12_4_ = auVar68._12_4_;
          auVar41 = auVar26 & auVar84 | auVar91;
          auVar41 = packssdw(auVar41,auVar41);
          auVar14._8_4_ = 0xffffffff;
          auVar14._0_8_ = 0xffffffffffffffff;
          auVar14._12_4_ = 0xffffffff;
          auVar41 = packssdw(auVar41 ^ auVar14,auVar41 ^ auVar14);
          auVar41 = packsswb(auVar41,auVar41);
          if ((auVar41 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            *(undefined1 *)(uVar38 + 0x281 + lVar39) = 0;
          }
          auVar41 = pshufhw(auVar41,auVar84,0x84);
          auVar27._4_4_ = iVar88;
          auVar27._0_4_ = iVar88;
          auVar27._8_4_ = iVar92;
          auVar27._12_4_ = iVar92;
          auVar75 = pshufhw(auVar68,auVar27,0x84);
          auVar71 = pshufhw(auVar41,auVar91,0x84);
          auVar46._8_4_ = 0xffffffff;
          auVar46._0_8_ = 0xffffffffffffffff;
          auVar46._12_4_ = 0xffffffff;
          auVar46 = (auVar71 | auVar75 & auVar41) ^ auVar46;
          auVar41 = packssdw(auVar46,auVar46);
          auVar41 = packsswb(auVar41,auVar41);
          if ((auVar41._10_2_ >> 8 & 1) != 0) {
            *(undefined1 *)(uVar38 + 0x2c1 + lVar39) = 0;
          }
          auVar41 = auVar55 ^ auVar32;
          auVar69._0_4_ = -(uint)(iVar50 < auVar41._0_4_);
          auVar69._4_4_ = -(uint)(iVar52 < auVar41._4_4_);
          auVar69._8_4_ = -(uint)(iVar73 < auVar41._8_4_);
          auVar69._12_4_ = -(uint)(iVar74 < auVar41._12_4_);
          auVar28._4_4_ = auVar69._0_4_;
          auVar28._0_4_ = auVar69._0_4_;
          auVar28._8_4_ = auVar69._8_4_;
          auVar28._12_4_ = auVar69._8_4_;
          auVar75 = pshuflw(auVar91,auVar28,0xe8);
          auVar47._0_4_ = -(uint)(auVar41._0_4_ == iVar50);
          auVar47._4_4_ = -(uint)(auVar41._4_4_ == iVar52);
          auVar47._8_4_ = -(uint)(auVar41._8_4_ == iVar73);
          auVar47._12_4_ = -(uint)(auVar41._12_4_ == iVar74);
          auVar85._4_4_ = auVar47._4_4_;
          auVar85._0_4_ = auVar47._4_4_;
          auVar85._8_4_ = auVar47._12_4_;
          auVar85._12_4_ = auVar47._12_4_;
          auVar41 = pshuflw(auVar47,auVar85,0xe8);
          auVar86._4_4_ = auVar69._4_4_;
          auVar86._0_4_ = auVar69._4_4_;
          auVar86._8_4_ = auVar69._12_4_;
          auVar86._12_4_ = auVar69._12_4_;
          auVar71 = pshuflw(auVar69,auVar86,0xe8);
          auVar15._8_4_ = 0xffffffff;
          auVar15._0_8_ = 0xffffffffffffffff;
          auVar15._12_4_ = 0xffffffff;
          auVar41 = packssdw(auVar41 & auVar75,(auVar71 | auVar41 & auVar75) ^ auVar15);
          auVar41 = packsswb(auVar41,auVar41);
          if ((auVar41 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(undefined1 *)(uVar38 + 0x301 + lVar39) = 0;
          }
          auVar29._4_4_ = auVar69._0_4_;
          auVar29._0_4_ = auVar69._0_4_;
          auVar29._8_4_ = auVar69._8_4_;
          auVar29._12_4_ = auVar69._8_4_;
          auVar86 = auVar85 & auVar29 | auVar86;
          auVar71 = packssdw(auVar86,auVar86);
          auVar16._8_4_ = 0xffffffff;
          auVar16._0_8_ = 0xffffffffffffffff;
          auVar16._12_4_ = 0xffffffff;
          auVar41 = packssdw(auVar41,auVar71 ^ auVar16);
          auVar41 = packsswb(auVar41,auVar41);
          if ((auVar41._12_2_ >> 8 & 1) != 0) {
            *(undefined1 *)(uVar38 + 0x341 + lVar39) = 0;
          }
          auVar41 = auVar53 ^ auVar32;
          auVar70._0_4_ = -(uint)(iVar50 < auVar41._0_4_);
          auVar70._4_4_ = -(uint)(iVar52 < auVar41._4_4_);
          auVar70._8_4_ = -(uint)(iVar73 < auVar41._8_4_);
          auVar70._12_4_ = -(uint)(iVar74 < auVar41._12_4_);
          auVar87._4_4_ = auVar70._0_4_;
          auVar87._0_4_ = auVar70._0_4_;
          auVar87._8_4_ = auVar70._8_4_;
          auVar87._12_4_ = auVar70._8_4_;
          iVar50 = -(uint)(auVar41._4_4_ == iVar52);
          iVar52 = -(uint)(auVar41._12_4_ == iVar74);
          auVar72._4_4_ = iVar50;
          auVar72._0_4_ = iVar50;
          auVar72._8_4_ = iVar52;
          auVar72._12_4_ = iVar52;
          auVar48._4_4_ = auVar70._4_4_;
          auVar48._0_4_ = auVar70._4_4_;
          auVar48._8_4_ = auVar70._12_4_;
          auVar48._12_4_ = auVar70._12_4_;
          auVar48 = auVar72 & auVar87 | auVar48;
          auVar41 = packssdw(auVar48,auVar48);
          auVar17._8_4_ = 0xffffffff;
          auVar17._0_8_ = 0xffffffffffffffff;
          auVar17._12_4_ = 0xffffffff;
          auVar41 = packssdw(auVar41 ^ auVar17,auVar41 ^ auVar17);
          auVar41 = packsswb(auVar41,auVar41);
          if ((auVar41 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(undefined1 *)(uVar38 + 0x381 + lVar39) = 0;
          }
          auVar41 = pshufhw(auVar41,auVar87,0x84);
          in_XMM11 = pshufhw(auVar70,auVar72,0x84);
          in_XMM11 = in_XMM11 & auVar41;
          auVar30._4_4_ = auVar70._4_4_;
          auVar30._0_4_ = auVar70._4_4_;
          auVar30._8_4_ = auVar70._12_4_;
          auVar30._12_4_ = auVar70._12_4_;
          auVar41 = pshufhw(auVar41,auVar30,0x84);
          auVar49._8_4_ = 0xffffffff;
          auVar49._0_8_ = 0xffffffffffffffff;
          auVar49._12_4_ = 0xffffffff;
          auVar49 = (auVar41 | in_XMM11) ^ auVar49;
          auVar41 = packssdw(auVar49,auVar49);
          auVar41 = packsswb(auVar41,auVar41);
          if ((auVar41._14_2_ >> 8 & 1) != 0) {
            *(undefined1 *)(uVar38 + 0x3c1 + lVar39) = 0;
          }
          lVar40 = (long)DAT_003d4560;
          lVar54 = auVar61._8_8_;
          auVar61._0_8_ = auVar61._0_8_ + lVar40;
          lVar51 = DAT_003d4560._8_8_;
          auVar61._8_8_ = lVar54 + lVar51;
          lVar54 = auVar60._8_8_;
          auVar60._0_8_ = auVar60._0_8_ + lVar40;
          auVar60._8_8_ = lVar54 + lVar51;
          lVar54 = auVar59._8_8_;
          auVar59._0_8_ = auVar59._0_8_ + lVar40;
          auVar59._8_8_ = lVar54 + lVar51;
          lVar54 = auVar58._8_8_;
          auVar58._0_8_ = auVar58._0_8_ + lVar40;
          auVar58._8_8_ = lVar54 + lVar51;
          lVar54 = auVar57._8_8_;
          auVar57._0_8_ = auVar57._0_8_ + lVar40;
          auVar57._8_8_ = lVar54 + lVar51;
          lVar54 = auVar56._8_8_;
          auVar56._0_8_ = auVar56._0_8_ + lVar40;
          auVar56._8_8_ = lVar54 + lVar51;
          lVar54 = auVar55._8_8_;
          auVar55._0_8_ = auVar55._0_8_ + lVar40;
          auVar55._8_8_ = lVar54 + lVar51;
          lVar54 = auVar53._8_8_;
          auVar53._0_8_ = auVar53._0_8_ + lVar40;
          auVar53._8_8_ = lVar54 + lVar51;
          lVar39 = lVar39 + 0x400;
          auVar41 = _DAT_003d4560;
        } while ((ulong)(iVar36 + 0xfU >> 4) << 10 != lVar39);
      }
      local_88.this = this;
      local_88.v = v;
      local_88.q = q;
      if (N < 0xb) {
        local_88.neighbourhoodData = &local_98;
        queryNeighbourhood::anon_class_32_4_8f8caa33::operator()(&local_88,0,N);
      }
      else {
        local_88.neighbourhoodData = &local_98;
        HighsTaskExecutor::threadLocalWorkerDequePtr::__tls_init();
        local_68.workerDeque = (HighsSplitDeque *)*local_58;
        local_68.dequeHead = ((local_68.workerDeque)->ownerData).head;
        do {
          pHVar34 = local_68.workerDeque;
          start = (uint)N >> 1;
          uVar3 = ((local_68.workerDeque)->ownerData).head;
          uVar38 = (ulong)uVar3;
          if (uVar38 < 0x2000) {
            ((local_68.workerDeque)->ownerData).head = uVar3 + 1;
            ((local_68.workerDeque)->taskArray)._M_elems[uVar38].metadata.stealer.
            super___atomic_base<unsigned_long>._M_i = 0;
            *(undefined ***)((local_68.workerDeque)->taskArray)._M_elems[uVar38].taskData =
                 &PTR_operator___00448ed8;
            *(uint *)(((local_68.workerDeque)->taskArray)._M_elems[uVar38].taskData + 8) = start;
            *(HighsInt *)(((local_68.workerDeque)->taskArray)._M_elems[uVar38].taskData + 0xc) = N;
            pHVar31 = ((local_68.workerDeque)->taskArray)._M_elems + uVar38;
            pHVar31->taskData[0x10] = '\n';
            pHVar31->taskData[0x11] = '\0';
            pHVar31->taskData[0x12] = '\0';
            pHVar31->taskData[0x13] = '\0';
            *(anon_class_32_4_8f8caa33 **)
             (((local_68.workerDeque)->taskArray)._M_elems[uVar38].taskData + 0x18) = &local_88;
            if (((local_68.workerDeque)->ownerData).allStolenCopy == true) {
              uVar4 = ((local_68.workerDeque)->ownerData).head;
              ((local_68.workerDeque)->stealerData).ts.super___atomic_base<unsigned_long>._M_i =
                   CONCAT44(uVar4 - 1,uVar4);
              ((local_68.workerDeque)->stealerData).allStolen._M_base._M_i = false;
              ((local_68.workerDeque)->ownerData).splitCopy =
                   ((local_68.workerDeque)->ownerData).head;
              ((local_68.workerDeque)->ownerData).allStolenCopy = false;
              if ((((local_68.workerDeque)->splitRequest)._M_base._M_i & 1U) != 0) {
                ((local_68.workerDeque)->splitRequest)._M_base._M_i = false;
              }
              peVar6 = ((local_68.workerDeque)->ownerData).workerBunk.
                       super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              LOCK();
              _Var2._M_i = (peVar6->haveJobs).super___atomic_base<int>._M_i;
              (peVar6->haveJobs).super___atomic_base<int>._M_i =
                   (peVar6->haveJobs).super___atomic_base<int>._M_i + 1;
              UNLOCK();
              if (_Var2._M_i < ((local_68.workerDeque)->ownerData).numWorkers + -1) {
                HighsSplitDeque::WorkerBunk::publishWork
                          (((local_68.workerDeque)->ownerData).workerBunk.
                           super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,local_68.workerDeque);
              }
            }
            else {
              HighsSplitDeque::growShared(local_68.workerDeque);
            }
          }
          else {
            if ((((local_68.workerDeque)->ownerData).splitCopy < 0x2000) &&
               (((local_68.workerDeque)->ownerData).allStolenCopy == false)) {
              HighsSplitDeque::growShared(local_68.workerDeque);
            }
            puVar1 = &(pHVar34->ownerData).head;
            *puVar1 = *puVar1 + 1;
            ::highs::parallel::
            for_each<HighsCliqueTable::queryNeighbourhood(std::vector<int,std::allocator<int>>&,long&,HighsCliqueTable::CliqueVar,HighsCliqueTable::CliqueVar*,int)const::__1&>
                      (start,N,&local_88,10);
          }
          bVar8 = 0x15 < (uint)N;
          N = start;
        } while (bVar8);
        queryNeighbourhood::anon_class_32_4_8f8caa33::operator()(&local_88,0,start);
        ::highs::parallel::TaskGroup::taskWait(&local_68);
        ::highs::parallel::TaskGroup::~TaskGroup(&local_68);
      }
      if (0 < local_98.numThreads) {
        lVar39 = 0x18;
        lVar40 = 0;
        do {
          uVar33._M_t.
          super___uniq_ptr_impl<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
          ._M_t.
          super__Tuple_impl<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
          .
          super__Head_base<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_false>
          ._M_head_impl =
               local_98.threadCopies_._M_t.
               super___uniq_ptr_impl<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
               .
               super__Head_base<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_false>
               ._M_head_impl;
          if (*(char *)((long)local_98.threadCopies_._M_t.
                              super___uniq_ptr_impl<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
                              .
                              super__Head_base<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_false>
                              ._M_head_impl + -0x18 + lVar39) == '\x01') {
            std::vector<int,std::allocator<int>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                      ((vector<int,std::allocator<int>> *)neighbourhoodInds,
                       (neighbourhoodInds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish,
                       *(undefined8 *)
                        ((long)local_98.threadCopies_._M_t.
                               super___uniq_ptr_impl<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
                               .
                               super__Head_base<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_false>
                               ._M_head_impl + -8 + lVar39),
                       *(undefined8 *)
                        ((long)local_98.threadCopies_._M_t.
                               super___uniq_ptr_impl<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
                               .
                               super__Head_base<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_false>
                               ._M_head_impl + lVar39));
            *local_50 = *local_50 +
                        *(long *)((long)uVar33._M_t.
                                        super___uniq_ptr_impl<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
                                        .
                                        super__Head_base<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_false>
                                        ._M_head_impl + -0x10 + lVar39);
          }
          lVar40 = lVar40 + 1;
          lVar39 = lVar39 + 0x40;
        } while (lVar40 < local_98.numThreads);
      }
      piVar5 = (neighbourhoodInds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar7 = (neighbourhoodInds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (piVar5 != piVar7) {
        uVar38 = (long)piVar7 - (long)piVar5 >> 2;
        iVar36 = 0;
        if (1 < uVar38) {
          iVar36 = 0;
          do {
            uVar38 = (long)uVar38 >> 1;
            iVar36 = iVar36 + 1;
          } while (1 < uVar38);
        }
        pdqsort_detail::
        pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>,true>
                  (piVar5,piVar7,iVar36,1);
      }
      HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ERGO-Code[P]HiGHS/src/mip/HighsCliqueTable.cpp:455:59)>
      ::~HighsCombinable(&local_98);
    }
  }
  return;
}

Assistant:

void HighsCliqueTable::queryNeighbourhood(
    std::vector<HighsInt>& neighbourhoodInds, int64_t& numQueries, CliqueVar v,
    CliqueVar* q, HighsInt N) const {
  neighbourhoodInds.clear();

  if (numCliques(v) == 0) return;

  if (numEntries - sizeTwoCliques.size() * 2 < minEntriesForParallelism) {
    for (HighsInt i = 0; i < N; ++i) {
      if (haveCommonClique(numQueries, v, q[i])) neighbourhoodInds.push_back(i);
    }
  } else {
    auto neighbourhoodData =
        makeHighsCombinable<ThreadNeighbourhoodQueryData>([N]() {
          ThreadNeighbourhoodQueryData d;
          d.neighbourhoodInds.reserve(N);
          d.numQueries = 0;
          return d;
        });
    highs::parallel::for_each(
        0, N,
        [this, &neighbourhoodData, v, q](HighsInt start, HighsInt end) {
          ThreadNeighbourhoodQueryData& d = neighbourhoodData.local();
          for (HighsInt i = start; i < end; ++i) {
            if (haveCommonClique(d.numQueries, v, q[i]))
              d.neighbourhoodInds.push_back(i);
          }
        },
        10);

    neighbourhoodData.combine_each([&](ThreadNeighbourhoodQueryData& d) {
      neighbourhoodInds.insert(neighbourhoodInds.end(),
                               d.neighbourhoodInds.begin(),
                               d.neighbourhoodInds.end());
      numQueries += d.numQueries;
    });
    pdqsort(neighbourhoodInds.begin(), neighbourhoodInds.end());
  }
}